

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManDeriveReason(Cbs2_Man_t *p,int Level)

{
  Cbs2_Que_t *p_00;
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int local_58;
  
  piVar7 = (p->pClauses).pData;
  lVar9 = (long)(p->pClauses).iHead;
  if (piVar7[lVar9] != 0) {
    __assert_fail("pQue->pData[pQue->iHead] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2d4,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  if (piVar7[lVar9 + 1] != 0) {
    __assert_fail("pQue->pData[pQue->iHead+1] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2d5,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  lVar9 = lVar9 + 2;
  iVar5 = (p->pClauses).iTail;
  local_58 = (int)lVar9;
  if (iVar5 <= local_58) {
    __assert_fail("pQue->iHead + 2 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2d6,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  p_00 = &p->pClauses;
  p->vTemp->nSize = 0;
  do {
    piVar7 = (p->pClauses).pData;
    if (iVar5 <= lVar9) {
      if (piVar7[p_00->iHead] != 0) {
        __assert_fail("pQue->pData[pQue->iHead] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x305,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
      }
      if (piVar7[(long)p_00->iHead + 1] == 0) {
        __assert_fail("pQue->pData[pQue->iHead+1] != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x306,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
      }
      (p->pClauses).iTail = local_58;
      for (iVar5 = 0; iVar5 < p->vTemp->nSize; iVar5 = iVar5 + 1) {
        iVar3 = Vec_IntEntry(p->vTemp,iVar5);
        Vec_StrWriteEntry(&p->vMark,iVar3,'\0');
      }
      uVar1 = (p->pClauses).iHead;
      iVar5 = (p->pClauses).iTail;
      if (iVar5 <= (int)(uVar1 + 1)) {
        __assert_fail("pQue->iHead+1 < pQue->iTail",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x2ab,"int Cbs2_QueFinish(Cbs2_Man_t *, int)");
      }
      lVar9 = (long)(int)uVar1;
      iVar5 = iVar5 + ~uVar1;
      (p->pClauses).pData[lVar9] = iVar5;
      iVar3 = (p->pClauses).iTail;
      (p->pClauses).iHead = iVar3;
      if (iVar5 != 1) {
        lVar8 = (long)iVar3;
        p_00->iHead = uVar1;
        lVar10 = 0;
        iVar5 = iVar3;
        for (; ((lVar9 < iVar5 && (iVar5 = (p->pClauses).pData[lVar9], iVar5 != 0)) &&
               (lVar8 != lVar9)); lVar9 = lVar9 + 1) {
          if (lVar10 != 0) {
            iVar6 = Cbs2_VarValue(p,iVar5);
            iVar5 = Abc_Var2Lit(iVar5,iVar6);
          }
          Cbs2_QuePush(p_00,iVar5);
          iVar5 = (p->pClauses).iTail;
          lVar10 = lVar10 + -4;
        }
        Cbs2_QuePush(p_00,0);
        Cbs2_QuePush(p_00,0);
        (p->pClauses).iHead = (p->pClauses).iTail;
        Cbs2_ManWatchClause(p,iVar3,(p->pClauses).pData[lVar8 + 1]);
        Cbs2_ManWatchClause(p,iVar3,(p->pClauses).pData[lVar8 + 2]);
      }
      return uVar1;
    }
    iVar5 = piVar7[lVar9];
    iVar3 = Cbs2_VarMark0(p,iVar5);
    if (iVar3 == 0) {
      Vec_StrWriteEntry(&p->vMark,iVar5,'\x01');
      Vec_IntPush(p->vTemp,iVar5);
      iVar3 = Cbs2_VarDecLevel(p,iVar5);
      if (iVar3 < Level) {
        lVar8 = (long)local_58;
        local_58 = local_58 + 1;
        (p->pClauses).pData[lVar8] = iVar5;
      }
      else {
        if (iVar3 != Level) {
          __assert_fail("iLitLevel == Level",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                        ,0x2ed,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
        }
        iVar3 = Cbs2_VarUnused(p,iVar5);
        if (iVar3 != 0) {
          __assert_fail("!Cbs2_VarUnused(p, iVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                        ,0x92,"int *Cbs2_VarReasonP(Cbs2_Man_t *, int)");
        }
        piVar7 = Vec_IntEntryP(&p->vLevReason,iVar5 * 3 + 1);
        if (*piVar7 == 0) {
          piVar2 = (p->pClauses).pData;
          if ((long)piVar7[1] == 0) {
            if (piVar2[(long)p_00->iHead + 1] != 0) {
              __assert_fail("pQue->pData[pQue->iHead+1] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                            ,0x2f1,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
            }
            piVar2[(long)p_00->iHead + 1] = iVar5;
          }
          else {
            iVar3 = piVar2[piVar7[1]];
            Cbs2_QueGrow(p_00,iVar3);
            iVar6 = piVar7[1];
            piVar7 = (p->pClauses).pData;
            iVar4 = Abc_Lit2Var(piVar7[(long)iVar6 + 1]);
            if (iVar5 != iVar4) {
              __assert_fail("iObj == Abc_Lit2Var(pLits[0])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                            ,0x300,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
            }
            for (lVar8 = 1; lVar8 < iVar3; lVar8 = lVar8 + 1) {
              iVar5 = Abc_Lit2Var(piVar7[(long)iVar6 + lVar8 + 1]);
              Cbs2_QuePush(p_00,iVar5);
            }
          }
        }
        else {
          Cbs2_QuePush(p_00,*piVar7);
          if (piVar7[1] != 0) {
            Cbs2_QuePush(p_00,piVar7[1]);
          }
        }
      }
    }
    lVar9 = lVar9 + 1;
    iVar5 = (p->pClauses).iTail;
  } while( true );
}

Assistant:

static inline int Cbs2_ManDeriveReason( Cbs2_Man_t * p, int Level )
{
    Cbs2_Que_t * pQue = &(p->pClauses);
    int i, k, iObj, iLitLevel, * pReason;
    assert( pQue->pData[pQue->iHead] == 0 );
    assert( pQue->pData[pQue->iHead+1] == 0 );
    assert( pQue->iHead + 2 < pQue->iTail );
    //for ( i = pQue->iHead + 2; i < pQue->iTail; i++ )
    //    assert( !Cbs2_VarMark0(p, pQue->pData[i]) );
    // compact literals
    Vec_IntClear( p->vTemp );
    for ( i = k = pQue->iHead + 2; i < pQue->iTail; i++ )
    {
        iObj = pQue->pData[i];
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Vec_IntPush( p->vTemp, iObj );
        // check decision level
        iLitLevel = Cbs2_VarDecLevel( p, iObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = iObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs2_VarReasonP( p, iObj );
        if ( pReason[0] == 0 && pReason[1] == 0 ) // no reason
        {
            assert( pQue->pData[pQue->iHead+1] == 0 );
            pQue->pData[pQue->iHead+1] = iObj;
        }
        else if ( pReason[0] != 0 ) // circuit reason
        {
            Cbs2_QuePush( pQue, pReason[0] );
            if ( pReason[1] )
            Cbs2_QuePush( pQue, pReason[1] );
        }
        else // clause reason
        {
            int i, * pLits, nLits = Cbs2_ClauseSize( p, pReason[1] );
            assert( pReason[1] );
            Cbs2_QueGrow( pQue, nLits );
            pLits = Cbs2_ClauseLits( p, pReason[1] );
            assert( iObj == Abc_Lit2Var(pLits[0]) );
            for ( i = 1; i < nLits; i++ )
                Cbs2_QuePush( pQue, Abc_Lit2Var(pLits[i]) );
        }
    }
    assert( pQue->pData[pQue->iHead] == 0 );
    assert( pQue->pData[pQue->iHead+1] != 0 );
    pQue->iTail = k;
    // clear the marks
    Vec_IntForEachEntry( p->vTemp, iObj, i )
        Cbs2_VarSetMark0(p, iObj, 0);
    return Cbs2_QueFinish( p, Level );
}